

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O2

int __thiscall despot::FVRS::GetObservation(FVRS *this,double rand_num,RockSampleState *rockstate)

{
  bool bVar1;
  undefined8 uVar2;
  uint uVar3;
  int rock;
  long lVar4;
  double dVar5;
  
  lVar4 = 0;
  uVar3 = 0;
  do {
    if ((this->super_BaseRockSample).num_rocks_ <= lVar4) {
      return uVar3;
    }
    uVar2 = BaseRockSample::GetRobPos(&this->super_BaseRockSample,&rockstate->super_State);
    dVar5 = (double)despot::Coord::EuclideanDistance
                              (uVar2,*(undefined8 *)
                                      ((this->super_BaseRockSample).rock_pos_.
                                       super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar4 * 8));
    dVar5 = exp2(-dVar5 / (this->super_BaseRockSample).half_efficiency_distance_);
    dVar5 = (dVar5 + 1.0) * 0.5;
    bVar1 = BaseRockSample::GetRock(&this->super_BaseRockSample,&rockstate->super_State,(uint)lVar4)
    ;
    if (dVar5 <= rand_num) {
      rand_num = rand_num - dVar5;
      if (dVar5 < 1.0) {
        rand_num = rand_num / (1.0 - rand_num);
      }
      if (!bVar1) goto LAB_00116706;
    }
    else if (bVar1) {
LAB_00116706:
      uVar3 = uVar3 | 1 << ((uint)lVar4 & 0x1f);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int FVRS::GetObservation(double rand_num,
	const RockSampleState& rockstate) const {
	int obs = 0;
	for (int rock = 0; rock < num_rocks_; rock++) {
		double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
			rock_pos_[rock]);
		double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
			* 0.5;

		// cout << efficiency << endl;
		bool bit = 0;
		if (rand_num < efficiency) {
			bit = GetRock(&rockstate, rock) & E_GOOD;
		} else {
			bit = !(GetRock(&rockstate, rock) & E_GOOD);

			rand_num -= efficiency;
			if (efficiency < 1.0)
				rand_num /= (1.0 - rand_num);
		}

		if (bit)
			SetFlag(obs, rock);
	}
	return obs;
}